

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall cfd::core::Address::CalculateTaproot(Address *this,string *bech32_hrp)

{
  ByteData local_38;
  
  SchnorrPubkey::GetData(&local_38,&this->schnorr_pubkey_);
  ByteData::operator=(&this->hash_,&local_38);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  CalculateBech32m(this,&this->hash_,bech32_hrp);
  return;
}

Assistant:

void Address::CalculateTaproot(const std::string& bech32_hrp) {
  hash_ = schnorr_pubkey_.GetData();
  CalculateBech32m(hash_, bech32_hrp);
}